

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathCastNumberToString(double val)

{
  int iVar1;
  xmlChar local_88 [8];
  char buf [100];
  xmlChar *local_18;
  xmlChar *ret;
  double val_local;
  
  iVar1 = xmlXPathIsInf(val);
  if (iVar1 == -1) {
    local_18 = xmlStrdup((xmlChar *)"-Infinity");
  }
  else if (iVar1 == 1) {
    local_18 = xmlStrdup("Infinity");
  }
  else {
    iVar1 = xmlXPathIsNaN(val);
    if (iVar1 == 0) {
      if ((val != 0.0) || (NAN(val))) {
        xmlXPathFormatNumber(val,(char *)local_88,99);
        buf[0x5b] = '\0';
        local_18 = xmlStrdup(local_88);
      }
      else {
        local_18 = xmlStrdup("0");
      }
    }
    else {
      local_18 = xmlStrdup((xmlChar *)"NaN");
    }
  }
  return local_18;
}

Assistant:

xmlChar *
xmlXPathCastNumberToString (double val) {
    xmlChar *ret;
    switch (xmlXPathIsInf(val)) {
    case 1:
	ret = xmlStrdup((const xmlChar *) "Infinity");
	break;
    case -1:
	ret = xmlStrdup((const xmlChar *) "-Infinity");
	break;
    default:
	if (xmlXPathIsNaN(val)) {
	    ret = xmlStrdup((const xmlChar *) "NaN");
	} else if (val == 0) {
            /* Omit sign for negative zero. */
	    ret = xmlStrdup((const xmlChar *) "0");
	} else {
	    /* could be improved */
	    char buf[100];
	    xmlXPathFormatNumber(val, buf, 99);
	    buf[99] = 0;
	    ret = xmlStrdup((const xmlChar *) buf);
	}
    }
    return(ret);
}